

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O2

void __thiscall duckdb::StringValueResult::~StringValueResult(StringValueResult *this)

{
  CSVErrorHandler::Insert
            (this->error_handler,(this->iterator->boundary).boundary_idx,*this->lines_read);
  if (this->iterator->done == false) {
    CSVErrorHandler::DontPrintErrorLine(this->error_handler);
  }
  ::std::__cxx11::string::~string((string *)&this->path);
  ::std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&(this->borked_rows)._M_h);
  StrTimeFormat::~StrTimeFormat(&(this->timestamp_format).super_StrTimeFormat);
  StrTimeFormat::~StrTimeFormat(&(this->date_format).super_StrTimeFormat);
  ::std::vector<duckdb::CurrentError,_std::allocator<duckdb::CurrentError>_>::~vector
            ((vector<duckdb::CurrentError,_std::allocator<duckdb::CurrentError>_> *)
             &this->current_errors);
  ::std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->buffer_handles)._M_h);
  ::std::unique_ptr<bool[],_std::default_delete<bool[]>_>::~unique_ptr
            (&(this->projected_columns).super_unique_ptr<bool[],_std::default_delete<bool[]>_>);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->csv_file_scan).internal.
              super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&this->names);
  ::std::unique_ptr<duckdb::ParseTypeInfo[],_std::default_delete<duckdb::ParseTypeInfo[]>_>::
  ~unique_ptr(&(this->parse_types).
               super_unique_ptr<duckdb::ParseTypeInfo[],_std::default_delete<duckdb::ParseTypeInfo[]>_>
             );
  ::std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::FullLinePosition>,_std::allocator<std::pair<const_unsigned_long,_duckdb::FullLinePosition>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->line_positions_per_row)._M_h);
  DataChunk::~DataChunk(&this->parse_chunk);
  ::std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::~unique_ptr
            (&(this->null_str_size).
              super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>);
  ::std::unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>::~unique_ptr
            (&(this->null_str_ptr).
              super_unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>);
  ::std::_Vector_base<duckdb::ValidityMask_*,_std::allocator<duckdb::ValidityMask_*>_>::
  ~_Vector_base((_Vector_base<duckdb::ValidityMask_*,_std::allocator<duckdb::ValidityMask_*>_> *)
                &this->validity_mask);
  ::std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base
            ((_Vector_base<void_*,_std::allocator<void_*>_> *)&this->vector_ptr);
  return;
}

Assistant:

StringValueResult::~StringValueResult() {
	// We have to insert the lines read by this scanner
	error_handler.Insert(iterator.GetBoundaryIdx(), lines_read);
	if (!iterator.done) {
		// Some operators, like Limit, might cause a future error to incorrectly report the wrong error line
		// Better to print nothing to print something wrong
		error_handler.DontPrintErrorLine();
	}
}